

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_read_op(sexp ctx,sexp self,sexp_sint_t n,sexp in)

{
  int iVar1;
  sexp psVar2;
  sexp ctx_00;
  sexp shares;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_30;
  sexp_gc_var_t local_28;
  
  local_30 = (sexp)&DAT_0000043e;
  local_28.var = (sexp_conflict *)0x0;
  local_28.next = (sexp_gc_var_t *)0x0;
  if ((((ulong)in & 3) == 0) && (in->tag == 0x10)) {
    iVar1 = sexp_maybe_block_port(ctx,in,0);
    if (iVar1 == 0) {
      local_28.var = &local_30;
      local_28.next = (ctx->value).context.saves;
      (ctx->value).context.saves = &local_28;
      ctx_00 = ctx;
      psVar2 = sexp_read_one(ctx,in,local_28.var);
      if ((((((ulong)psVar2 & 3) != 0) || (psVar2->tag != 0x13)) && (((ulong)local_30 & 3) == 0)) &&
         (local_30->tag == 10)) {
        psVar2 = sexp_fill_reader_labels(ctx,psVar2,local_30,1);
        ctx_00 = ctx;
        psVar2 = sexp_fill_reader_labels(ctx,psVar2,local_30,0);
      }
      sexp_maybe_unblock_port(ctx_00,in);
      (ctx->value).context.saves = local_28.next;
    }
    else {
      psVar2 = (sexp)(((ctx->value).type.setters)->value).context.mark_stack[8].end;
    }
    return psVar2;
  }
  psVar2 = sexp_type_exception(ctx,self,0x10,in);
  return psVar2;
}

Assistant:

sexp sexp_read_op (sexp ctx, sexp self, sexp_sint_t n, sexp in) {
  sexp res;
  sexp_gc_var1(shares);
  sexp_assert_type(ctx, sexp_iportp, SEXP_IPORT, in);
  sexp_check_block_port(ctx, in, 0);
  sexp_gc_preserve1(ctx, shares);
  res = sexp_read_one(ctx, in, &shares);
#if SEXP_USE_READER_LABELS
  if (!sexp_exceptionp(res) && sexp_vectorp(shares)) {
    res = sexp_fill_reader_labels(ctx, res, shares, 1);  /* mark=1 */
    res = sexp_fill_reader_labels(ctx, res, shares, 0);  /* mark=0 */
  }
#endif
  sexp_maybe_unblock_port(ctx, in);
  sexp_gc_release1(ctx);
  return res;
}